

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# a_fog.cpp
# Opt level: O3

int AF_A_FogSpawn(VMFrameStack *stack,VMValue *param,int numparam,VMReturn *ret,int numret)

{
  VM_UBYTE VVar1;
  undefined8 *puVar2;
  PClass *pPVar3;
  int iVar4;
  uint uVar5;
  undefined4 extraout_var;
  PClass *pPVar6;
  PClassActor *type;
  AActor *pAVar7;
  AActor *pAVar8;
  VMValue *pVVar9;
  char *__assertion;
  bool bVar10;
  bool bVar11;
  FName local_4c;
  DVector3 local_48;
  
  pPVar3 = AActor::RegistrationInfo.MyClass;
  if (numparam < 1) {
    __assertion = "(paramnum) < numparam";
    goto LAB_005df7be;
  }
  if ((param->field_0).field_3.Type == '\x03') {
    pAVar8 = (AActor *)(param->field_0).field_1.a;
    if ((param->field_0).field_1.atag == 1) {
      if (pAVar8 == (AActor *)0x0) {
LAB_005df595:
        pAVar8 = (AActor *)0x0;
        pVVar9 = param;
        uVar5 = numparam;
      }
      else {
        pPVar6 = (pAVar8->super_DThinker).super_DObject.Class;
        if (pPVar6 == (PClass *)0x0) {
          iVar4 = (**(pAVar8->super_DThinker).super_DObject._vptr_DObject)(pAVar8);
          pPVar6 = (PClass *)CONCAT44(extraout_var,iVar4);
          (pAVar8->super_DThinker).super_DObject.Class = pPVar6;
        }
        bVar10 = pPVar6 == (PClass *)0x0;
        ret = (VMReturn *)(ulong)!bVar10;
        bVar11 = pPVar6 == pPVar3;
        if (!bVar11 && !bVar10) {
          do {
            pPVar6 = pPVar6->ParentClass;
            ret = (VMReturn *)(ulong)(pPVar6 != (PClass *)0x0);
            if (pPVar6 == pPVar3) break;
          } while (pPVar6 != (PClass *)0x0);
        }
        pVVar9 = (VMValue *)(ulong)(bVar11 || bVar10);
        uVar5 = (uint)bVar10;
        if ((char)ret == '\0') {
          __assertion = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
          goto LAB_005df7be;
        }
      }
      pPVar3 = AActor::RegistrationInfo.MyClass;
      if (numparam == 1) goto LAB_005df655;
      VVar1 = param[1].field_0.field_3.Type;
      if (VVar1 != 0xff) {
        if (VVar1 != '\x03') goto LAB_005df7ae;
        puVar2 = (undefined8 *)param[1].field_0.field_1.a;
        if (param[1].field_0.field_1.atag == 1) {
          if (puVar2 != (undefined8 *)0x0) {
            pPVar6 = (PClass *)puVar2[1];
            if (pPVar6 == (PClass *)0x0) {
              pPVar6 = (PClass *)(**(code **)*puVar2)(puVar2,pVVar9,uVar5,ret);
              puVar2[1] = pPVar6;
            }
            bVar10 = pPVar6 != (PClass *)0x0;
            if (pPVar6 != pPVar3 && bVar10) {
              do {
                pPVar6 = pPVar6->ParentClass;
                bVar10 = pPVar6 != (PClass *)0x0;
                if (pPVar6 == pPVar3) break;
              } while (pPVar6 != (PClass *)0x0);
            }
            if (!bVar10) {
              __assertion = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AActor))";
              goto LAB_005df7be;
            }
          }
        }
        else if (puVar2 != (undefined8 *)0x0) goto LAB_005df7ae;
      }
      if (((numparam < 3) || (VVar1 = param[2].field_0.field_3.Type, VVar1 == 0xff)) ||
         ((VVar1 == '\x03' &&
          ((param[2].field_0.field_1.atag == 8 || (param[2].field_0.field_1.a == (void *)0x0)))))) {
LAB_005df655:
        iVar4 = pAVar8->special1;
        pAVar8->special1 = iVar4 + -1;
        if (iVar4 < 1) {
          pAVar8->special1 = pAVar8->args[2];
          uVar5 = FRandom::GenRand32(&pr_fogspawn);
          local_4c.Index =
               FName::NameManager::FindName
                         (&FName::NameData,
                          _ZZL13AF_A_FogSpawnP12VMFrameStackP7VMValueiP8VMReturniE4fogs_rel +
                          *(int *)(_ZZL13AF_A_FogSpawnP12VMFrameStackP7VMValueiP8VMReturniE4fogs_rel
                                  + (ulong)(byte)((char)uVar5 + (char)((uVar5 & 0xff) / 3) * -3) * 4
                                  ),false);
          local_48.X = (pAVar8->__Pos).X;
          local_48.Y = (pAVar8->__Pos).Y;
          local_48.Z = (pAVar8->__Pos).Z;
          type = ClassForSpawn(&local_4c);
          pAVar7 = AActor::StaticSpawn(type,&local_48,ALLOW_REPLACE,false);
          if (pAVar7 != (AActor *)0x0) {
            iVar4 = pAVar8->args[1] + (uint)(pAVar8->args[1] == 0);
            uVar5 = FRandom::GenRand32(&pr_fogspawn);
            (pAVar7->Angles).Yaw.Degrees =
                 (double)((int)((long)(ulong)(uVar5 & 0xff) % (long)iVar4) - (iVar4 >> 1)) * 1.40625
                 + (pAVar8->Angles).Yaw.Degrees;
            (pAVar7->target).field_0.p = pAVar8;
            if (pAVar8->args[0] < 1) {
              pAVar8->args[0] = 1;
            }
            uVar5 = FRandom::GenRand32(&pr_fogspawn);
            pAVar7->args[0] = (int)((long)(ulong)(uVar5 & 0xff) % (long)pAVar8->args[0]) + 1;
            pAVar7->args[3] = pAVar8->args[3];
            pAVar7->args[4] = 1;
            uVar5 = FRandom::GenRand32(&pr_fogspawn);
            pAVar7->WeaveIndexZ = (byte)uVar5 & 0x3f;
          }
        }
        return 0;
      }
      __assertion = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_STATEINFO || param[paramnum].a == NULL)"
      ;
      goto LAB_005df7be;
    }
    if (pAVar8 == (AActor *)0x0) goto LAB_005df595;
  }
LAB_005df7ae:
  __assertion = 
  "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
  ;
LAB_005df7be:
  __assert_fail(__assertion,
                "/workspace/llm4binary/github/license_c_cmakelists/alexey-lysiuk[P]gzdoom/src/g_hexen/a_fog.cpp"
                ,0x1e,"int AF_A_FogSpawn(VMFrameStack *, VMValue *, int, VMReturn *, int)");
}

Assistant:

DEFINE_ACTION_FUNCTION(AActor, A_FogSpawn)
{
	PARAM_ACTION_PROLOGUE;

	static const char *fogs[3] =
	{
		"FogPatchSmall",
		"FogPatchMedium",
		"FogPatchLarge"
	};

	AActor *mo = NULL;
	int delta;

	if (self->special1-- > 0)
	{
		return 0;
	}
	self->special1 = self->args[2];		// Reset frequency count

	mo = Spawn (fogs[pr_fogspawn()%3], self->Pos(), ALLOW_REPLACE);

	if (mo)
	{
		delta = self->args[1];
		if (delta==0) delta=1;
		mo->Angles.Yaw = self->Angles.Yaw + (((pr_fogspawn() % delta) - (delta >> 1)) * (360 / 256.));
		mo->target = self;
		if (self->args[0] < 1) self->args[0] = 1;
		mo->args[0] = (pr_fogspawn() % (self->args[0]))+1;	// Random speed
		mo->args[3] = self->args[3];						// Set lifetime
		mo->args[4] = 1;									// Set to moving
		mo->WeaveIndexZ = pr_fogspawn()&63;
	}
	return 0;
}